

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.h
# Opt level: O2

void w128_from_bitstream(bitstream_t *bs,word128 *v,size_t width,size_t size)

{
  uint64_t uVar1;
  uint64_t *puVar2;
  uint64_t buf [4];
  
  puVar2 = buf + (width - 1);
  buf = (uint64_t  [4])ZEXT1632(ZEXT816(0) << 0x40);
  for (; 0x3f < size; size = size - 0x40) {
    uVar1 = bitstream_get_bits(bs,0x40);
    *puVar2 = uVar1;
    puVar2 = puVar2 + -1;
  }
  if (size != 0) {
    uVar1 = bitstream_get_bits(bs,(uint)size);
    *puVar2 = uVar1 << ((ulong)(byte)-(char)size & 0x3f);
  }
  (*v)[0] = buf[0];
  (*v)[1] = buf[1];
  v[1][0] = buf[2];
  v[1][1] = buf[3];
  return;
}

Assistant:

ATTR_TARGET_S128
static inline void w128_from_bitstream(bitstream_t* bs, word128 v[2], const size_t width,
                                       const size_t size) {
  ATTR_ALIGNED(16) uint64_t buf[4] = {0};
  uint64_t* d                      = &buf[width - 1];
  size_t bits                      = size;
  for (; bits >= sizeof(uint64_t) * 8; bits -= sizeof(uint64_t) * 8, --d) {
    *d = bitstream_get_bits(bs, sizeof(uint64_t) * 8);
  }
  if (bits) {
    *d = bitstream_get_bits(bs, bits) << (sizeof(uint64_t) * 8 - bits);
  }

  v[0] = mm128_load(&buf[0]);
  v[1] = mm128_load(&buf[2]);
}